

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2_debug_state.c
# Opt level: O0

void append_chunk(h2o_mem_pool_t *pool,h2o_iovec_vector_t *chunks,char *fmt,...)

{
  h2o_iovec_t *phVar1;
  size_t sVar2;
  char in_AL;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *pcStack_50;
  h2o_iovec_t v;
  undefined4 local_38;
  int size;
  va_list args;
  char *fmt_local;
  h2o_iovec_vector_t *chunks_local;
  h2o_mem_pool_t *pool_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Da;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  size = 0x30;
  local_38 = 0x18;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  args[0].reg_save_area = fmt;
  v.len._4_4_ = vsnprintf((char *)0x0,0,fmt,&local_38);
  if (0 < v.len._4_4_) {
    pcStack_50 = (char *)h2o_mem_alloc_pool(pool,(long)(v.len._4_4_ + 1));
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    size = 0x30;
    local_38 = 0x18;
    iVar3 = vsnprintf(pcStack_50,(long)(v.len._4_4_ + 1),(char *)args[0].reg_save_area,&local_38);
    v.base = (char *)(long)iVar3;
    h2o_vector__reserve(pool,(h2o_vector_t *)chunks,0x10,chunks->size + 1);
    phVar1 = chunks->entries;
    sVar2 = chunks->size;
    chunks->size = sVar2 + 1;
    phVar1[sVar2].base = pcStack_50;
    phVar1[sVar2].len = (size_t)v.base;
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/http2_debug_state.c"
                ,0x4a,"void append_chunk(h2o_mem_pool_t *, h2o_iovec_vector_t *, const char *, ...)"
               );
}

Assistant:

__attribute__((format(printf, 3, 4))) static void append_chunk(h2o_mem_pool_t *pool, h2o_iovec_vector_t *chunks, const char *fmt,
                                                               ...)
{
    va_list args;

    va_start(args, fmt);
    int size = vsnprintf(NULL, 0, fmt, args);
    va_end(args);

    assert(size > 0);

    h2o_iovec_t v;
    v.base = h2o_mem_alloc_pool(pool, size + 1);

    va_start(args, fmt);
    v.len = vsnprintf(v.base, size + 1, fmt, args);
    va_end(args);

    h2o_vector_reserve(pool, chunks, chunks->size + 1);
    chunks->entries[chunks->size++] = v;
}